

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O1

int arkStep_NlsFPFunction_MassIdent_TrivialPredAutonomous(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  int nls_iter;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_28;
  int local_1c;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (arkode_mem,"arkStep_NlsFPFunction_MassIdent_TrivialPredAutonomous",&local_18,
                     &local_28);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,local_28->zpred,zcor,local_18->ycur);
    iVar2 = SUNNonlinSolGetCurIter(local_28->NLS,&local_1c);
    iVar1 = -0x20;
    if (iVar2 == 0) {
      if ((local_1c == 0) && (local_28->fn_implicit != (N_Vector)0x0)) {
        N_VScale(0x3ff0000000000000,local_28->fn_implicit,local_28->Fi[local_28->istage]);
      }
      else {
        iVar1 = (*local_28->nls_fi)(local_18->tcur,local_18->ycur,local_28->Fi[local_28->istage],
                                    local_18->user_data);
        local_28->nfi = local_28->nfi + 1;
        if (iVar1 < 0) {
          return -8;
        }
        if (iVar1 != 0) {
          return 9;
        }
      }
      N_VLinearSum(local_28->gamma,0x3ff0000000000000,local_28->Fi[local_28->istage],local_28->sdata
                   ,g);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsFPFunction_MassIdent_TrivialPredAutonomous(N_Vector zcor,
                                                          N_Vector g,
                                                          void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nls_iter;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS if not already available */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nls_iter);
  if (retval != ARK_SUCCESS) { return ARK_NLS_OP_ERR; }

  if (nls_iter == 0 && step_mem->fn_implicit)
  {
    N_VScale(ONE, step_mem->fn_implicit, step_mem->Fi[step_mem->istage]);
  }
  else
  {
    /* compute implicit RHS and save for later */
    retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[step_mem->istage], ark_mem->user_data);
    step_mem->nfi++;
    if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
    if (retval > 0) { return (RHSFUNC_RECVR); }
  }

  /* combine parts:  g = gamma*Fi(z) + sdata */
  N_VLinearSum(step_mem->gamma, step_mem->Fi[step_mem->istage], ONE,
               step_mem->sdata, g);

  return (ARK_SUCCESS);
}